

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::mousePressEvent(QTreeView *this,QMouseEvent *event)

{
  QTreeViewPrivate *this_00;
  bool bVar1;
  int iVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  double dVar4;
  undefined1 auVar5 [16];
  QModelIndex local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar3 = QWidget::style((QWidget *)this);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x28,0,this,0);
  if (iVar2 == 2) {
    auVar5 = QEventPoint::position();
    dVar4 = (double)((ulong)auVar5._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar5._0_8_;
    bVar1 = 2147483647.0 < dVar4;
    if (dVar4 <= -2147483648.0) {
      dVar4 = -2147483648.0;
    }
    local_38.r = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
    dVar4 = (double)((ulong)auVar5._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar5._8_8_;
    bVar1 = 2147483647.0 < dVar4;
    if (dVar4 <= -2147483648.0) {
      dVar4 = -2147483648.0;
    }
    local_38.c = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
    bVar1 = QTreeViewPrivate::expandOrCollapseItemAtPos(this_00,(QPoint *)&local_38);
    if (!bVar1) goto LAB_005a2a8f;
  }
  else {
LAB_005a2a8f:
    auVar5 = QEventPoint::position();
    dVar4 = (double)((ulong)auVar5._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar5._0_8_;
    bVar1 = 2147483647.0 < dVar4;
    if (dVar4 <= -2147483648.0) {
      dVar4 = -2147483648.0;
    }
    local_38.r = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
    dVar4 = (double)((ulong)auVar5._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar5._8_8_;
    bVar1 = 2147483647.0 < dVar4;
    if (dVar4 <= -2147483648.0) {
      dVar4 = -2147483648.0;
    }
    local_38.c = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
    iVar2 = QTreeViewPrivate::itemDecorationAt(this_00,(QPoint *)&local_38);
    if (iVar2 == -1) {
      QAbstractItemView::mousePressEvent((QAbstractItemView *)this,event);
      goto LAB_005a2b5f;
    }
  }
  local_38.r = -1;
  local_38.c = -1;
  local_38.i = 0;
  local_38.m.ptr = (QAbstractItemModel *)0x0;
  QPersistentModelIndex::operator=
            (&(this_00->super_QAbstractItemViewPrivate).pressedIndex,&local_38);
LAB_005a2b5f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::mousePressEvent(QMouseEvent *event)
{
    Q_D(QTreeView);
    bool handled = false;
    if (style()->styleHint(QStyle::SH_ListViewExpand_SelectMouseType, nullptr, this) == QEvent::MouseButtonPress)
        handled = d->expandOrCollapseItemAtPos(event->position().toPoint());
    if (!handled && d->itemDecorationAt(event->position().toPoint()) == -1)
        QAbstractItemView::mousePressEvent(event);
    else
        d->pressedIndex = QModelIndex();
}